

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O3

void uavs3d_if_hor_luma(pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,
                       int max_val)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  int iVar12;
  int iVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 uVar24;
  
  if (0 < height) {
    iVar12 = 0;
    do {
      if (0 < width) {
        uVar14 = 0;
        do {
          uVar1 = *(ulong *)(src + (uVar14 - 3));
          auVar2._8_6_ = 0;
          auVar2._0_8_ = uVar1;
          auVar2[0xe] = (char)(uVar1 >> 0x38);
          auVar3._8_4_ = 0;
          auVar3._0_8_ = uVar1;
          auVar3[0xc] = (char)(uVar1 >> 0x30);
          auVar3._13_2_ = auVar2._13_2_;
          auVar4._8_4_ = 0;
          auVar4._0_8_ = uVar1;
          auVar4._12_3_ = auVar3._12_3_;
          auVar5._8_2_ = 0;
          auVar5._0_8_ = uVar1;
          auVar5[10] = (char)(uVar1 >> 0x28);
          auVar5._11_4_ = auVar4._11_4_;
          auVar6._8_2_ = 0;
          auVar6._0_8_ = uVar1;
          auVar6._10_5_ = auVar5._10_5_;
          auVar7[8] = (char)(uVar1 >> 0x20);
          auVar7._0_8_ = uVar1;
          auVar7._9_6_ = auVar6._9_6_;
          auVar9._7_8_ = 0;
          auVar9._0_7_ = auVar7._8_7_;
          auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
          auVar10[0] = (char)(uVar1 >> 0x18);
          auVar10._9_6_ = 0;
          auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
          auVar11[0] = (char)(uVar1 >> 0x10);
          auVar11._11_4_ = 0;
          auVar8[2] = (char)(uVar1 >> 8);
          auVar8._0_2_ = (ushort)uVar1;
          auVar8._3_12_ = SUB1512(auVar11 << 0x20,3);
          auVar23._0_2_ = (ushort)uVar1 & 0xff;
          auVar23._2_13_ = auVar8._2_13_;
          auVar23[0xf] = 0;
          uVar1 = *(ulong *)coeff;
          uVar24 = (undefined1)(uVar1 >> 0x38);
          auVar21._8_6_ = 0;
          auVar21._0_8_ = uVar1;
          auVar21[0xe] = uVar24;
          auVar21[0xf] = uVar24;
          uVar24 = (undefined1)(uVar1 >> 0x30);
          auVar20._14_2_ = auVar21._14_2_;
          auVar20._8_5_ = 0;
          auVar20._0_8_ = uVar1;
          auVar20[0xd] = uVar24;
          auVar19._13_3_ = auVar20._13_3_;
          auVar19._8_4_ = 0;
          auVar19._0_8_ = uVar1;
          auVar19[0xc] = uVar24;
          uVar24 = (undefined1)(uVar1 >> 0x28);
          auVar18._12_4_ = auVar19._12_4_;
          auVar18._8_3_ = 0;
          auVar18._0_8_ = uVar1;
          auVar18[0xb] = uVar24;
          auVar17._11_5_ = auVar18._11_5_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = uVar1;
          auVar17[10] = uVar24;
          uVar24 = (undefined1)(uVar1 >> 0x20);
          auVar16._10_6_ = auVar17._10_6_;
          auVar16[8] = 0;
          auVar16._0_8_ = uVar1;
          auVar16[9] = uVar24;
          auVar15._9_7_ = auVar16._9_7_;
          auVar15[8] = uVar24;
          auVar15._0_8_ = uVar1;
          uVar24 = (undefined1)(uVar1 >> 0x18);
          auVar22._8_8_ = auVar15._8_8_;
          auVar22[7] = uVar24;
          auVar22[6] = uVar24;
          uVar24 = (undefined1)(uVar1 >> 0x10);
          auVar22[5] = uVar24;
          auVar22[4] = uVar24;
          uVar24 = (undefined1)(uVar1 >> 8);
          auVar22[3] = uVar24;
          auVar22[2] = uVar24;
          auVar22[0] = (undefined1)uVar1;
          auVar22[1] = auVar22[0];
          auVar22 = psraw(auVar22,8);
          auVar23 = pmaddwd(auVar22,auVar23);
          iVar13 = auVar23._12_4_ + auVar23._4_4_ + auVar23._8_4_ + auVar23._0_4_ + 0x20 >> 6;
          if (max_val <= iVar13) {
            iVar13 = max_val;
          }
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          dst[uVar14] = (pel)iVar13;
          uVar14 = uVar14 + 1;
        } while ((uint)width != uVar14);
      }
      src = src + i_src;
      dst = dst + i_dst;
      iVar12 = iVar12 + 1;
    } while (iVar12 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sum, val;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_HOR(src, col, coeff);
            val = (sum + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        src += i_src;
        dst += i_dst;
    }
}